

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::BitmapFillRespsectsClipsFillAreaByBitmapBounds(RendererTests *this)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  allocator local_229;
  blender<int,_unsigned_char> blender;
  LocationInfo local_210;
  rect_i r;
  bitmap<int,_0UL,_0UL> bitmap2;
  bitmap<int,_0UL,_0UL> bitmap1;
  string local_198;
  fill_log_entry reference2 [7];
  fill_log_entry reference1 [6];
  
  r.x1 = -1;
  r.y1 = -0x3ea;
  r.x2 = 3000;
  r.y2 = 0x98;
  uVar3 = 5;
  mocks::bitmap<int,_0UL,_0UL>::bitmap(&bitmap1,5,6);
  uVar2 = 0xf;
  mocks::bitmap<int,_0UL,_0UL>::bitmap(&bitmap2,0xf,7);
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fill<agge::tests::mocks::bitmap<int,0ul,0ul>,agge::tests::mocks::blender<int,unsigned_char>>
            (&bitmap1,&r,&blender);
  uVar1 = (ulong)bitmap1._width;
  reference1[0].pixels =
       bitmap1.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  reference1[0].x = 0;
  reference1[0].y = 0;
  reference1[1].pixels =
       bitmap1.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1;
  reference1[1].x = 0;
  reference1[1].y = 1;
  reference1[2].pixels =
       bitmap1.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 2;
  reference1[2].x = 0;
  reference1[2].y = 2;
  reference1[3].pixels =
       bitmap1.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 3;
  reference1[3].x = 0;
  reference1[3].y = 3;
  reference1[4].pixels =
       bitmap1.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 4;
  reference1[4].x = 0;
  reference1[4].y = 4;
  reference1[5].pixels =
       bitmap1.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 5;
  reference1[5].x = 0;
  reference1[5].y = 5;
  reference1[0].length = uVar3;
  reference1[1].length = uVar3;
  reference1[2].length = uVar3;
  reference1[3].length = uVar3;
  reference1[4].length = uVar3;
  reference1[5].length = uVar3;
  std::__cxx11::string::string
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,(allocator *)&local_198);
  ut::LocationInfo::LocationInfo((LocationInfo *)reference2,&local_210.filename,0x416);
  ut::
  are_equal<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,6ul,std::vector<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,std::allocator<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry>>>
            (&reference1,&blender.filling_log,(LocationInfo *)reference2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (blender.filling_log.
      super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      blender.filling_log.
      super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    blender.filling_log.
    super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         blender.filling_log.
         super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  fill<agge::tests::mocks::bitmap<int,0ul,0ul>,agge::tests::mocks::blender<int,unsigned_char>>
            (&bitmap2,&r,&blender);
  reference2[0].pixels =
       bitmap2.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  reference2[0].x = 0;
  reference2[0].y = 0;
  uVar1 = (ulong)bitmap2._width;
  reference2[1].pixels =
       bitmap2.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1;
  reference2[1].x = 0;
  reference2[1].y = 1;
  reference2[2].pixels =
       bitmap2.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 2;
  reference2[2].x = 0;
  reference2[2].y = 2;
  reference2[3].pixels =
       bitmap2.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 3;
  reference2[3].x = 0;
  reference2[3].y = 3;
  reference2[4].pixels =
       bitmap2.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 4;
  reference2[4].x = 0;
  reference2[4].y = 4;
  reference2[5].pixels =
       bitmap2.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 5;
  reference2[5].x = 0;
  reference2[5].y = 5;
  reference2[6].pixels =
       bitmap2.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 6;
  reference2[6].x = 0;
  reference2[6].y = 6;
  reference2[0].length = uVar2;
  reference2[1].length = uVar2;
  reference2[2].length = uVar2;
  reference2[3].length = uVar2;
  reference2[4].length = uVar2;
  reference2[5].length = uVar2;
  reference2[6].length = uVar2;
  std::__cxx11::string::string
            ((string *)&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_229);
  ut::LocationInfo::LocationInfo(&local_210,&local_198,0x429);
  ut::
  are_equal<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,7ul,std::vector<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,std::allocator<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry>>>
            (&reference2,&blender.filling_log,&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::
  _Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                   *)&blender);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&bitmap2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&bitmap1);
  return;
}

Assistant:

test( BitmapFillRespsectsClipsFillAreaByBitmapBounds )
			{
				// INIT
				rect_i r = { -1, -1002, 3000, 152 };
				mocks::bitmap<int> bitmap1(5, 6);
				mocks::bitmap<int> bitmap2(15, 7);
				mocks::blender<int, uint8_t> blender;

				// ACT
				fill(bitmap1, r, blender);

				// ASSERT
				mocks::blender<int, uint8_t>::fill_log_entry reference1[] = {
					{ bitmap1.row_ptr(0), 0, 0, 5 },
					{ bitmap1.row_ptr(1), 0, 1, 5 },
					{ bitmap1.row_ptr(2), 0, 2, 5 },
					{ bitmap1.row_ptr(3), 0, 3, 5 },
					{ bitmap1.row_ptr(4), 0, 4, 5 },
					{ bitmap1.row_ptr(5), 0, 5, 5 },
				};

				assert_equal(reference1, blender.filling_log);

				// INIT
				blender.filling_log.clear();

				// ACT
				fill(bitmap2, r, blender);

				// ASSERT
				mocks::blender<int, uint8_t>::fill_log_entry reference2[] = {
					{ bitmap2.row_ptr(0), 0, 0, 15 },
					{ bitmap2.row_ptr(1), 0, 1, 15 },
					{ bitmap2.row_ptr(2), 0, 2, 15 },
					{ bitmap2.row_ptr(3), 0, 3, 15 },
					{ bitmap2.row_ptr(4), 0, 4, 15 },
					{ bitmap2.row_ptr(5), 0, 5, 15 },
					{ bitmap2.row_ptr(6), 0, 6, 15 },
				};

				assert_equal(reference2, blender.filling_log);
			}